

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCut.c
# Opt level: O0

int Bmc_GiaGenerateJust_rec(Gia_Man_t *p,int iFrame,int iObj,Vec_Bit_t *vValues,Vec_Bit_t *vJustis)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int Shift;
  Gia_Obj_t *pObj;
  Vec_Bit_t *vJustis_local;
  Vec_Bit_t *vValues_local;
  int iObj_local;
  int iFrame_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  iVar1 = iVar1 * iFrame;
  if (iFrame < 0) {
    p_local._4_4_ = 0;
  }
  else {
    if (iFrame < 0) {
      __assert_fail("iFrame >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                    ,0x34,
                    "int Bmc_GiaGenerateJust_rec(Gia_Man_t *, int, int, Vec_Bit_t *, Vec_Bit_t *)");
    }
    iVar2 = Vec_BitEntry(vJustis,iVar1 + iObj);
    if (iVar2 == 0) {
      Vec_BitWriteEntry(vJustis,iVar1 + iObj,1);
      pGVar4 = Gia_ManObj(p,iObj);
      iVar2 = Gia_ObjIsCo(pGVar4);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjIsCi(pGVar4);
        if (iVar2 == 0) {
          iVar2 = Gia_ObjIsAnd(pGVar4);
          if (iVar2 == 0) {
            __assert_fail("Gia_ObjIsAnd(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                          ,0x3d,
                          "int Bmc_GiaGenerateJust_rec(Gia_Man_t *, int, int, Vec_Bit_t *, Vec_Bit_t *)"
                         );
          }
          iVar2 = Vec_BitEntry(vValues,iVar1 + iObj);
          if (iVar2 == 0) {
            iVar2 = Gia_ObjFaninId0(pGVar4,iObj);
            iVar2 = Vec_BitEntry(vValues,iVar1 + iVar2);
            iVar3 = Gia_ObjFaninC0(pGVar4);
            if (iVar2 == iVar3) {
              iVar1 = Gia_ObjFaninId0(pGVar4,iObj);
              Bmc_GiaGenerateJust_rec(p,iFrame,iVar1,vValues,vJustis);
            }
            else {
              iVar2 = Gia_ObjFaninId1(pGVar4,iObj);
              iVar1 = Vec_BitEntry(vValues,iVar1 + iVar2);
              iVar2 = Gia_ObjFaninC1(pGVar4);
              if (iVar1 != iVar2) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                              ,0x47,
                              "int Bmc_GiaGenerateJust_rec(Gia_Man_t *, int, int, Vec_Bit_t *, Vec_Bit_t *)"
                             );
              }
              iVar1 = Gia_ObjFaninId1(pGVar4,iObj);
              Bmc_GiaGenerateJust_rec(p,iFrame,iVar1,vValues,vJustis);
            }
          }
          else {
            iVar1 = Gia_ObjFaninId0(pGVar4,iObj);
            Bmc_GiaGenerateJust_rec(p,iFrame,iVar1,vValues,vJustis);
            iVar1 = Gia_ObjFaninId1(pGVar4,iObj);
            Bmc_GiaGenerateJust_rec(p,iFrame,iVar1,vValues,vJustis);
          }
          p_local._4_4_ = 0;
        }
        else {
          pGVar4 = Gia_ObjRoToRi(p,pGVar4);
          iVar1 = Gia_ObjId(p,pGVar4);
          p_local._4_4_ = Bmc_GiaGenerateJust_rec(p,iFrame + -1,iVar1,vValues,vJustis);
        }
      }
      else {
        iVar1 = Gia_ObjFaninId0(pGVar4,iObj);
        p_local._4_4_ = Bmc_GiaGenerateJust_rec(p,iFrame,iVar1,vValues,vJustis);
      }
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Generate justifying assignments.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Bmc_GiaGenerateJust_rec( Gia_Man_t * p, int iFrame, int iObj, Vec_Bit_t * vValues, Vec_Bit_t * vJustis )
{
    Gia_Obj_t * pObj;
    int Shift = Gia_ManObjNum(p) * iFrame;
    if ( iFrame < 0 )
        return 0;
    assert( iFrame >= 0 );
    if ( Vec_BitEntry( vJustis, Shift + iObj ) )
        return 0;
    Vec_BitWriteEntry( vJustis, Shift + iObj, 1 );
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCo(pObj) )
        return Bmc_GiaGenerateJust_rec( p, iFrame, Gia_ObjFaninId0(pObj, iObj), vValues, vJustis );
    if ( Gia_ObjIsCi(pObj) )
        return Bmc_GiaGenerateJust_rec( p, iFrame-1, Gia_ObjId(p, Gia_ObjRoToRi(p, pObj)), vValues, vJustis );
    assert( Gia_ObjIsAnd(pObj) );
    if ( Vec_BitEntry( vValues, Shift + iObj ) )
    {
        Bmc_GiaGenerateJust_rec( p, iFrame, Gia_ObjFaninId0(pObj, iObj), vValues, vJustis );
        Bmc_GiaGenerateJust_rec( p, iFrame, Gia_ObjFaninId1(pObj, iObj), vValues, vJustis );
    }
    else if ( Vec_BitEntry( vValues, Shift + Gia_ObjFaninId0(pObj, iObj) ) == Gia_ObjFaninC0(pObj) )
        Bmc_GiaGenerateJust_rec( p, iFrame, Gia_ObjFaninId0(pObj, iObj), vValues, vJustis );
    else if ( Vec_BitEntry( vValues, Shift + Gia_ObjFaninId1(pObj, iObj) ) == Gia_ObjFaninC1(pObj) )
        Bmc_GiaGenerateJust_rec( p, iFrame, Gia_ObjFaninId1(pObj, iObj), vValues, vJustis );
    else assert( 0 );
    return 0;
}